

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# digest.c
# Opt level: O2

char * auth_digest_string_quoted(char *source)

{
  char *pcVar1;
  char *pcVar2;
  char *d;
  char cVar3;
  size_t sVar4;
  
  sVar4 = 1;
  pcVar1 = source;
  do {
    cVar3 = *pcVar1;
    if (cVar3 == '\"') {
LAB_00506918:
      sVar4 = sVar4 + 2;
    }
    else {
      if (cVar3 == '\0') {
        pcVar2 = (char *)(*Curl_cmalloc)(sVar4);
        pcVar1 = pcVar2;
        if (pcVar2 == (char *)0x0) {
          return (char *)0x0;
        }
        do {
          cVar3 = *source;
          if ((cVar3 == '\"') || (cVar3 == '\\')) {
            *pcVar1 = '\\';
            pcVar1 = pcVar1 + 1;
            cVar3 = *source;
          }
          else if (cVar3 == '\0') {
            *pcVar1 = '\0';
            return pcVar2;
          }
          source = source + 1;
          *pcVar1 = cVar3;
          pcVar1 = pcVar1 + 1;
        } while( true );
      }
      if (cVar3 == '\\') goto LAB_00506918;
      sVar4 = sVar4 + 1;
    }
    pcVar1 = pcVar1 + 1;
  } while( true );
}

Assistant:

static char *auth_digest_string_quoted(const char *source)
{
  char *dest;
  const char *s = source;
  size_t n = 1; /* null terminator */

  /* Calculate size needed */
  while(*s) {
    ++n;
    if(*s == '"' || *s == '\\') {
      ++n;
    }
    ++s;
  }

  dest = malloc(n);
  if(dest) {
    char *d = dest;
    s = source;
    while(*s) {
      if(*s == '"' || *s == '\\') {
        *d++ = '\\';
      }
      *d++ = *s++;
    }
    *d = '\0';
  }

  return dest;
}